

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void xPredIntraAngAdi_XY_19(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  int local_294;
  int local_290;
  int offsety_1;
  pel *py_1;
  int offsety;
  pel *py;
  int c;
  int b;
  int a;
  pel *px;
  int offsetx;
  int step1_width;
  int step2_height;
  int iTempD;
  int xsteps [64];
  int xoffsets [64];
  pel *dst_base;
  pel *rpSrc;
  int j;
  int i;
  int iHeight_local;
  int iWidth_local;
  int uiDirMode_local;
  int i_dst_local;
  pel *dst_local;
  pel *pSrc_local;
  
  step1_width = 0x5d;
  iVar2 = iWidth * 0x5d >> 7;
  for (rpSrc._4_4_ = 0; rpSrc._4_4_ < iWidth; rpSrc._4_4_ = rpSrc._4_4_ + 1) {
    xsteps[(long)rpSrc._4_4_ + 0x3e] = step1_width >> 2 & 0x1f;
    (&step2_height)[rpSrc._4_4_] = step1_width >> 7;
    step1_width = step1_width + 0x5d;
  }
  step1_width = 0xb;
  local_290 = iHeight;
  if (iVar2 < iHeight) {
    local_290 = iVar2;
  }
  _uiDirMode_local = dst;
  for (rpSrc._0_4_ = 0; (int)rpSrc < local_290; rpSrc._0_4_ = (int)rpSrc + 1) {
    iVar2 = (int)((double)(((int)rpSrc + 1) * 0x80) / 93.0 + 0.9999) + -1;
    uVar1 = step1_width & 7;
    local_294 = iWidth;
    if (iVar2 < iWidth) {
      local_294 = iVar2;
    }
    for (rpSrc._4_4_ = 0; rpSrc._4_4_ < local_294; rpSrc._4_4_ = rpSrc._4_4_ + 1) {
      pbVar3 = pSrc + ((long)(&step2_height)[rpSrc._4_4_] - (long)(int)rpSrc);
      iVar2 = xsteps[(long)rpSrc._4_4_ + 0x3e];
      _uiDirMode_local[rpSrc._4_4_] =
           (pel)((int)((uint)pbVar3[-2] * (0x20 - iVar2) + (uint)pbVar3[-1] * (0x40 - iVar2) +
                       (uint)*pbVar3 * (iVar2 + 0x20) + (uint)pbVar3[1] * iVar2 + 0x40) >> 7);
    }
    _b = pSrc + ((long)rpSrc._4_4_ - (long)(step1_width >> 3));
    for (; rpSrc._4_4_ < iWidth; rpSrc._4_4_ = rpSrc._4_4_ + 1) {
      _uiDirMode_local[rpSrc._4_4_] =
           (pel)((int)((uint)_b[2] * (uVar1 * -4 + 0x20) + (uint)_b[1] * (uVar1 * -4 + 0x40) +
                       (uint)*_b * (uVar1 * 4 + 0x20) + (uint)_b[-1] * uVar1 * 4 + 0x40) >> 7);
      _b = _b + 1;
    }
    _uiDirMode_local = _uiDirMode_local + i_dst;
    step1_width = step1_width + 0xb;
  }
  for (; (int)rpSrc < iHeight; rpSrc._0_4_ = (int)rpSrc + 1) {
    for (rpSrc._4_4_ = 0; rpSrc._4_4_ < iWidth; rpSrc._4_4_ = rpSrc._4_4_ + 1) {
      pbVar3 = pSrc + ((long)(&step2_height)[rpSrc._4_4_] - (long)(int)rpSrc);
      iVar2 = xsteps[(long)rpSrc._4_4_ + 0x3e];
      _uiDirMode_local[rpSrc._4_4_] =
           (pel)((int)((uint)pbVar3[-2] * (0x20 - iVar2) + (uint)pbVar3[-1] * (0x40 - iVar2) +
                       (uint)*pbVar3 * (iVar2 + 0x20) + (uint)pbVar3[1] * iVar2 + 0x40) >> 7);
    }
    _uiDirMode_local = _uiDirMode_local + i_dst;
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_19(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    int i, j;
    pel *rpSrc = pSrc;
    pel *dst_base = dst - 8 * i_dst - 11;
    int xoffsets[64];
    int xsteps[64];
    int iTempD = 93;
    int step2_height = ((93 * iWidth) >> 7);

    for (i = 0; i < iWidth; i++, iTempD += 93) {
        xoffsets[i] = (iTempD >> 2) & 0x1f;
        xsteps[i] = iTempD >> 7;
    }

    iTempD = 11;

    step2_height = min(step2_height, iHeight);

    for (j = 0; j < step2_height; j++, iTempD += 11) {
        int step1_width = (int)(((j + 1) << 7) / 93.0 + 0.9999) - 1;
        int offsetx = (iTempD << 2) & 0x1f;
        pel *px = pSrc - (iTempD >> 3);
        int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;

        step1_width = min(step1_width, iWidth);

        for (i = 0; i < step1_width; i++) {
            pel *py = rpSrc - j + xsteps[i];
            int offsety = xoffsets[i];
            dst[i] = (py[-2] * (32 - offsety) + py[-1] * (64 - offsety) + py[0] * (32 + offsety) + py[1] * offsety + 64) >> 7;
        }
        px += i;

        for (; i < iWidth; i++, px++) {
            dst[i] = (px[2] * a + px[1] * b + px[0] * c + px[-1] * offsetx + 64) >> 7;
        }
        dst_base += i_dst;
        dst += i_dst;
    }

    for (; j < iHeight; j++) {
        for (i = 0; i < iWidth; i++) {
            pel *py = rpSrc - j + xsteps[i];
            int offsety = xoffsets[i];
            dst[i] = (py[-2] * (32 - offsety) + py[-1] * (64 - offsety) + py[0] * (32 + offsety) + py[1] * offsety + 64) >> 7;
        }
        dst_base += i_dst;
        dst += i_dst;
    }
}